

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# check_op.cc
# Opt level: O2

void absl::lts_20250127::log_internal::MakeCheckOpValueString(ostream *os,char v)

{
  ostream *poVar1;
  
  if ((byte)(v - 0x20U) < 0x5f) {
    poVar1 = std::operator<<(os,"\'");
    poVar1 = std::operator<<(poVar1,v);
    std::operator<<(poVar1,"\'");
    return;
  }
  poVar1 = std::operator<<(os,"signed char value ");
  std::ostream::operator<<(poVar1,(int)v);
  return;
}

Assistant:

void MakeCheckOpValueString(std::ostream& os, const signed char v) {
  if (v >= 32 && v <= 126) {
    os << "'" << v << "'";
  } else {
    os << "signed char value " << int{v};
  }
}